

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[47],char_const*,char[15],char[107],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [47],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [107],char **Args_4,char (*Args_5) [20],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_6,
          char (*Args_7) [6],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_8,
          char (*Args_9) [192])

{
  stringstream local_1d8 [8];
  stringstream ss;
  char **Args_local_4;
  char (*Args_local_3) [107];
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [47];
  
  std::__cxx11::stringstream::stringstream(local_1d8);
  FormatStrSS<std::__cxx11::stringstream,char[47],char_const*,char[15],char[107],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
             (char (*) [47])this,(char **)Args,(char (*) [15])Args_1,(char (*) [107])Args_2,
             (char **)Args_3,(char (*) [20])Args_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_5,
             (char (*) [6])Args_6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_7,
             (char (*) [192])Args_8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}